

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go_emit.cc
# Opt level: O1

string * __thiscall
re2c::output_yych_abi_cxx11_(string *__return_storage_ptr__,re2c *this,bool *readCh)

{
  pointer pcVar1;
  long lVar2;
  opt_t *poVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  string local_30;
  
  if (*this == (re2c)0x1) {
    *this = (re2c)0x0;
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    InputAPI::expr_peek_save_abi_cxx11_(&local_30,&poVar3->input_api);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_30,0,(char *)0x0,0x149057);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_40 = *plVar5;
      lStack_38 = plVar4[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar5;
      local_50 = (long *)*plVar4;
    }
    local_48 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar6 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar6) {
      lVar2 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (poVar3->yych)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (poVar3->yych)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string output_yych (bool & readCh)
{
	if (readCh)
	{
		readCh = false;
		return "(" + opts->input_api.expr_peek_save () + ")";
	}
	else
	{
		return opts->yych;
	}
}